

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::BufferTest::Test<float,2,true>
          (BufferTest *this,bool use_range_version)

{
  bool bVar1;
  GLenum internal_format;
  bool result;
  bool use_range_version_local;
  BufferTest *this_local;
  
  internal_format = Reference::InternalFormat<float,2,true>();
  bVar1 = PrepareFramebuffer(this,internal_format);
  if (bVar1) {
    bVar1 = CreateBufferTexture<float,2,true>(this,use_range_version);
    if (bVar1) {
      Draw(this);
      this_local._7_1_ = Check<float,2,true>(this);
      CleanFramebuffer(this);
      CleanBufferTexture(this);
      CleanErrors(this);
    }
    else {
      CleanFramebuffer(this);
      CleanErrors(this);
      this_local._7_1_ = false;
    }
  }
  else {
    CleanFramebuffer(this);
    CleanErrors(this);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool BufferTest::Test(bool use_range_version)
{
	/* Setup. */
	if (!PrepareFramebuffer(InternalFormat<T, S, N>()))
	{
		/**
                 * If the framebuffer it not supported, means that the
                 * tested combination is unsupported for this driver,
                 * but allowed to be unsupported by OpenGL spec, so we
                 * just skip.
                 */
		CleanFramebuffer();
		CleanErrors();

		return true;
	}

	if (!CreateBufferTexture<T, S, N>(use_range_version))
	{
		CleanFramebuffer();
		CleanErrors();

		return false;
	}

	/* Action. */
	Draw();

	/* Compare results with reference. */
	bool result = Check<T, S, N>();

	/* Cleanup. */
	CleanFramebuffer();
	CleanBufferTexture();
	CleanErrors();

	/* Pass result. */
	return result;
}